

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O1

void read_frequency(frequency_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  time_exactness_t tVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  frequency_t *__dest;
  
  record->trip_id[0] = '\0';
  record->start_time[0] = '\0';
  record->end_time[0] = '\0';
  record->headway_secs = 0;
  record->exact_times = TE_NOT_EXACT;
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar5 = field_names[uVar4];
      iVar1 = strcmp(pcVar5,"trip_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar4];
        __dest = record;
LAB_00105243:
        strcpy(__dest->trip_id,pcVar5);
      }
      else {
        iVar1 = strcmp(pcVar5,"start_time");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (frequency_t *)record->start_time;
          goto LAB_00105243;
        }
        iVar1 = strcmp(pcVar5,"end_time");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (frequency_t *)record->end_time;
          goto LAB_00105243;
        }
        iVar1 = strcmp(pcVar5,"headway_secs");
        if (iVar1 == 0) {
          lVar3 = strtol(field_values[uVar4],(char **)0x0,0);
          record->headway_secs = (int)lVar3;
        }
        else {
          iVar1 = strcmp(pcVar5,"exact_times");
          if (iVar1 == 0) {
            tVar2 = parse_time_exactness(field_values[uVar4]);
            record->exact_times = tVar2;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_frequency(frequency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_frequency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->trip_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_time") == 0) {
            strcpy(record->start_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_time") == 0) {
            strcpy(record->end_time, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "headway_secs") == 0) {
            record->headway_secs = (int)strtol(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "exact_times") == 0) {
            record->exact_times = parse_time_exactness(field_values[i]);
            continue;
        }
    }
}